

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

string * __thiscall
BCLog::Logger::GetLogPrefix_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,LogFlags category,Level level)

{
  bool bVar1;
  const_iterator cVar2;
  Level extraout_EDX;
  Level extraout_EDX_00;
  Level level_00;
  LogFlags LVar3;
  long in_FS_OFFSET;
  LogFlags local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  LVar3 = -(ulong)(category == NONE) | category;
  bVar1 = this->m_always_print_category_level;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (level == Info && (LVar3 == ALL && bVar1 == false)) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_0016dae0;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  level_00 = extraout_EDX;
  if (LVar3 == ALL && bVar1 == false) {
LAB_0016da98:
    LogLevelToStr_abi_cxx11_(&local_58,(Logger *)(ulong)level,level_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               local_58.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  else {
    local_60 = LVar3;
    if (LVar3 == ALL) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58.field_2._M_allocated_capacity._0_4_ = 0x6c6c61;
      local_58._M_string_length = 3;
    }
    else {
      cVar2 = std::
              _Hashtable<BCLog::LogFlags,_std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<BCLog::LogFlags>,_std::hash<BCLog::LogFlags>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&LOG_CATEGORIES_BY_FLAG_abi_cxx11_._M_h,&local_60);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        __assert_fail("it != LOG_CATEGORIES_BY_FLAG.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                      ,0xfc,"std::string LogCategoryToStr(BCLog::LogFlags)");
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,
                 *(long *)((long)cVar2.
                                 super__Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                 ._M_cur + 0x10),
                 *(long *)((long)cVar2.
                                 super__Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                 ._M_cur + 0x18) +
                 *(long *)((long)cVar2.
                                 super__Node_iterator_base<std::pair<const_BCLog::LogFlags,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                 ._M_cur + 0x10));
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                               local_58.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((level != Debug) || (this->m_always_print_category_level != false)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,":");
      level_00 = extraout_EDX_00;
      goto LAB_0016da98;
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"] ");
LAB_0016dae0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string BCLog::Logger::GetLogPrefix(BCLog::LogFlags category, BCLog::Level level) const
{
    if (category == LogFlags::NONE) category = LogFlags::ALL;

    const bool has_category{m_always_print_category_level || category != LogFlags::ALL};

    // If there is no category, Info is implied
    if (!has_category && level == Level::Info) return {};

    std::string s{"["};
    if (has_category) {
        s += LogCategoryToStr(category);
    }

    if (m_always_print_category_level || !has_category || level != Level::Debug) {
        // If there is a category, Debug is implied, so don't add the level

        // Only add separator if we have a category
        if (has_category) s += ":";
        s += Logger::LogLevelToStr(level);
    }

    s += "] ";
    return s;
}